

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

string * __thiscall
cmQtAutoGen::Tools_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,bool moc,bool uic,bool rcc)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  char **ppcVar4;
  bool bVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> lst;
  char *local_b8 [7];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_80;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  
  ppcVar4 = local_b8;
  local_b8[4] = (char *)0x0;
  local_b8[5] = (char *)0x0;
  local_b8[2] = (char *)0x0;
  local_b8[3] = (char *)0x0;
  local_b8[0] = (char *)0x0;
  local_b8[1] = (char *)0x0;
  bVar5 = (int)this != 0;
  if (bVar5) {
    ppcVar4 = local_b8 + 2;
    local_b8[0] = (char *)0x7;
    local_b8[1] = "AUTOMOC";
  }
  uVar1 = (uint)bVar5;
  if (moc) {
    uVar1 = uVar1 + 1;
    *ppcVar4 = (char *)0x7;
    ppcVar4[1] = "AUTOUIC";
  }
  uVar2 = uVar1;
  if (uic) {
    uVar2 = uVar1 + 1;
    *(undefined8 *)((long)local_b8 + (ulong)(uVar1 << 4)) = 7;
    *(char **)((long)local_b8 + (ulong)(uVar1 << 4) + 8) = "AUTORCC";
  }
  if (uVar2 == 3) {
    local_68 = 2;
    local_60 = ", ";
    local_38 = 5;
    local_30 = " and ";
    local_28 = 0;
    local_20 = local_b8[4];
    uStack_18 = local_b8[5];
    local_10 = 0;
    sVar3 = 5;
  }
  else {
    if (uVar2 != 2) {
      if (uVar2 == 1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,local_b8[1],local_b8[1] + (long)local_b8[0]);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    local_68 = 5;
    local_60 = " and ";
    sVar3 = 3;
  }
  local_40 = 0;
  uStack_48 = local_b8[3];
  local_50 = local_b8[2];
  local_58 = 0;
  local_80.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80.first._M_str = local_b8[1];
  local_80.first._M_len = (size_t)local_b8[0];
  views._M_array = &local_80;
  views._M_len = sVar3;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Tools(bool moc, bool uic, bool rcc)
{
  std::array<cm::string_view, 3> lst;
  decltype(lst)::size_type num = 0;
  if (moc) {
    lst.at(num++) = "AUTOMOC";
  }
  if (uic) {
    lst.at(num++) = "AUTOUIC";
  }
  if (rcc) {
    lst.at(num++) = "AUTORCC";
  }
  switch (num) {
    case 1:
      return std::string(lst[0]);
    case 2:
      return cmStrCat(lst[0], " and ", lst[1]);
    case 3:
      return cmStrCat(lst[0], ", ", lst[1], " and ", lst[2]);
    default:
      break;
  }
  return std::string();
}